

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProxyLogger.cpp
# Opt level: O2

void __thiscall liblogger::ProxyLogger::LogInfo(ProxyLogger *this,char *fmt,...)

{
  char in_AL;
  int iVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  allocator<char> local_111;
  char *tmp;
  string str;
  va_list ap;
  undefined1 local_c8 [16];
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  ap[0].reg_save_area = local_c8;
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  tmp = (char *)0x0;
  ap[0].overflow_arg_area = &stack0x00000008;
  ap[0].gp_offset = 0x10;
  ap[0].fp_offset = 0x30;
  local_b8 = in_RDX;
  local_b0 = in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  iVar1 = vasprintf(&tmp,fmt,ap);
  if (-1 < iVar1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&str,tmp,&local_111);
    liblogger::Logger(LOGGER_INFO,"%s %s ",(this->m_prefix)._M_dataplus._M_p,str._M_dataplus._M_p);
    free(tmp);
    std::__cxx11::string::~string((string *)&str);
    return;
  }
  abort();
}

Assistant:

void ProxyLogger::LogInfo(const char *fmt, ...) {
	char *tmp = 0;

	va_list ap;
	va_start(ap, fmt);
	int res = vasprintf(&tmp, fmt, ap);
	if (res < 0)
		abort();
	std::string str = tmp;
	liblogger::Logger(LOGGER_INFO, "%s %s ", m_prefix.c_str(), str.c_str());
	free(tmp);
	va_end(ap);
}